

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void handle_frame(cio_websocket *websocket,uint8_t *data,uint64_t length)

{
  cio_utf8_state *arg0;
  cio_response_buffer *pcVar1;
  uint8_t *__dest;
  cio_write_buffer *pcVar2;
  cio_http_client *pcVar3;
  uint uVar4;
  bool bVar5;
  uint8_t uVar6;
  uint16_t uVar7;
  uint i;
  uint uVar8;
  cio_error err;
  uint64_t uVar9;
  uint i_1;
  ulong uVar11;
  char *reason;
  size_t sVar12;
  cio_websocket_status_code status_code;
  ulong uVar13;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  anon_struct_4_7_799a2f31_for_ws_flags aVar17;
  uint_fast8_t uVar18;
  byte bVar19;
  size_t len;
  size_t sVar20;
  size_t __n;
  _Bool _Var21;
  uint_fast32_t aligned_mask;
  ulong local_38;
  ulong uVar10;
  
  aVar17 = (websocket->ws_private).ws_flags;
  uVar4 = (uint)length;
  if (((uint)aVar17 >> 10 & 1) != 0) {
    aligned_mask = 0;
    if (length < 8) {
      if (length != 0) {
        uVar9 = 0;
        do {
          data[uVar9] = data[uVar9] ^ (websocket->ws_private).received_mask[(uint)uVar9 & 3];
          uVar9 = uVar9 + 1;
        } while (length != uVar9);
      }
    }
    else {
      uVar8 = -(int)data & 7;
      uVar10 = (ulong)uVar8;
      uVar13 = length - uVar10;
      lVar14 = 0;
      do {
        *(uint8_t *)((long)&aligned_mask + lVar14) =
             (websocket->ws_private).received_mask[(int)lVar14 - (int)data & 3];
        lVar14 = lVar14 + 1;
      } while (lVar14 != 8);
      uVar11 = (ulong)((uint)uVar13 & 7);
      if (uVar10 != 0) {
        lVar14 = 0;
        do {
          data[lVar14] = data[lVar14] ^ (websocket->ws_private).received_mask[(uint)lVar14 & 3];
          lVar14 = lVar14 + 1;
        } while (uVar8 != (uint)lVar14);
      }
      if (7 < uVar13) {
        uVar16 = 0;
        do {
          *(ulong *)(data + uVar16 * 8 + uVar10) =
               *(ulong *)(data + uVar16 * 8 + uVar10) ^ aligned_mask;
          uVar16 = uVar16 + 1;
        } while (uVar13 >> 3 != uVar16);
      }
      if (length - uVar11 < length) {
        lVar14 = -uVar11;
        do {
          data[lVar14 + length] =
               data[lVar14 + length] ^
               (websocket->ws_private).received_mask[uVar4 + (int)lVar14 & 3];
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0);
      }
    }
    aVar17._2_2_ = 0;
    aVar17._0_2_ = *(ushort *)&(websocket->ws_private).ws_flags;
  }
  uVar18 = (uint_fast8_t)length;
  switch((uint)aVar17 >> 1 & 0xf) {
  case 1:
    arg0 = &(websocket->ws_private).utf8_state;
    uVar6 = cio_check_utf8(arg0,data,length);
    if ((uVar6 == '\f') || ((uVar6 != '\0' & aVar17._0_1_) != 0)) {
      handle_frame_cold_3();
      return;
    }
    sVar20 = (websocket->ws_private).remaining_read_frame_length;
    if (((uint)aVar17 & 1) != 0) {
      cio_utf8_init(arg0);
    }
    if (sVar20 != 0) {
      lVar14 = 0;
      do {
        *(uint8_t *)((long)&aligned_mask + lVar14) =
             (websocket->ws_private).received_mask[uVar4 + (int)lVar14 & 3];
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      *(undefined4 *)(websocket->ws_private).received_mask = (undefined4)aligned_mask;
    }
    sVar12 = (websocket->ws_private).read_frame_length;
    pvVar15 = (websocket->ws_private).read_handler_context;
    _Var21 = false;
    goto LAB_0010dce1;
  case 2:
    sVar20 = (websocket->ws_private).remaining_read_frame_length;
    if (sVar20 != 0) {
      lVar14 = 0;
      do {
        *(uint8_t *)((long)&aligned_mask + lVar14) =
             (websocket->ws_private).received_mask[uVar4 + (int)lVar14 & 3];
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      *(undefined4 *)(websocket->ws_private).received_mask = (undefined4)aligned_mask;
    }
    sVar12 = (websocket->ws_private).read_frame_length;
    pvVar15 = (websocket->ws_private).read_handler_context;
    _Var21 = true;
LAB_0010dce1:
    (*(websocket->ws_private).read_handler)
              (websocket,pvVar15,CIO_SUCCESS,sVar12,data,length,sVar20 == 0,
               (_Bool)(aVar17._0_1_ & 1),_Var21);
    return;
  default:
    reason = "reserved opcode used";
    break;
  case 8:
    local_38 = length & 0xff;
    if (uVar18 == '\0') {
      bVar5 = true;
      uVar7 = 1000;
LAB_0010de75:
      if (websocket->on_control !=
          (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)0x0) {
        (*websocket->on_control)(websocket,CIO_WEBSOCKET_CLOSE_FRAME,data,uVar18);
      }
      if (((websocket->ws_private).ws_flags.field_0x1 & 2) == 0) {
        uVar7 = cio_htobe16(uVar7);
        *(uint16_t *)(websocket->ws_private).close_buffer.buffer = uVar7;
        sVar20 = 2;
        if (!bVar5) {
          __n = 0x7b;
          if (local_38 < 0x7b) {
            __n = local_38;
          }
          memcpy((websocket->ws_private).close_buffer.buffer + 2,data + 2,__n);
          sVar20 = __n + 2;
        }
        pcVar1 = &(websocket->ws_private).close_buffer;
        pcVar2 = &(websocket->ws_private).close_buffer.write_buffer;
        (websocket->ws_private).close_buffer.write_buffer.data.head.q_len =
             (size_t)(websocket->ws_private).close_buffer.buffer;
        (websocket->ws_private).close_buffer.write_buffer.data.element.length = sVar20;
        (websocket->ws_private).close_buffer.write_buffer.next = &pcVar1->wb_head;
        (websocket->ws_private).close_buffer.write_buffer.prev = &pcVar1->wb_head;
        (websocket->ws_private).close_buffer.wb_head.next = pcVar2;
        (websocket->ws_private).close_buffer.wb_head.prev = pcVar2;
        (websocket->ws_private).close_buffer.wb_head.data.head.q_len = 1;
        (websocket->ws_private).close_buffer.wb_head.data.element.length = sVar20;
        (websocket->ws_private).write_close_job.wbh = &pcVar1->wb_head;
        (websocket->ws_private).write_close_job.handler = (cio_websocket_write_handler_t)0x0;
        (websocket->ws_private).write_close_job.handler_context = (void *)0x0;
        (websocket->ws_private).write_close_job.frame_type = CIO_WEBSOCKET_CLOSE_FRAME;
        (websocket->ws_private).write_close_job.last_frame = true;
        (websocket->ws_private).write_close_job.stream_handler = response_close_frame_written;
        enqueue_job(websocket,&(websocket->ws_private).write_close_job,sVar20);
        return;
      }
      handle_frame_cold_1();
      return;
    }
    if ((uVar4 & 0xff) != 1) {
      uVar7 = cio_be16toh(*(uint16_t *)data);
      if ((((ushort)(uVar7 + 0xec78) < 0xf830) && ((uVar7 & 0xfffc) != 1000)) &&
         ((ushort)(uVar7 - 0x3f4) < 0xfffb)) {
        handle_frame_cold_2();
        return;
      }
      bVar19 = uVar18 - 2;
      if (bVar19 == 0) {
        bVar5 = true;
        local_38 = 0;
      }
      else {
        cio_utf8_init((cio_utf8_state *)&aligned_mask);
        local_38 = (ulong)bVar19;
        uVar6 = cio_check_utf8((cio_utf8_state *)&aligned_mask,data + 2,(ulong)bVar19 - 2);
        if (uVar6 != '\0') {
          handle_error(websocket,CIO_PROTOCOL_NOT_SUPPORTED,CIO_WEBSOCKET_CLOSE_UNSUPPORTED_DATA,
                       "reason in close frame not utf8 valid");
          return;
        }
        bVar5 = false;
      }
      goto LAB_0010de75;
    }
    reason = "close payload of length 1";
    break;
  case 9:
    pcVar1 = &(websocket->ws_private).ping_buffer;
    (websocket->ws_private).ping_buffer.wb_head.prev = &pcVar1->wb_head;
    (websocket->ws_private).ping_buffer.wb_head.next = &pcVar1->wb_head;
    (websocket->ws_private).ping_buffer.wb_head.data.head.q_len = 0;
    (websocket->ws_private).ping_buffer.wb_head.data.element.length = 0;
    if (uVar18 == '\0') {
      sVar20 = 0;
    }
    else {
      __dest = (websocket->ws_private).ping_buffer.buffer;
      sVar20 = length & 0xff;
      memcpy(__dest,data,sVar20);
      pcVar2 = &(websocket->ws_private).ping_buffer.write_buffer;
      (websocket->ws_private).ping_buffer.write_buffer.data.head.q_len = (size_t)__dest;
      (websocket->ws_private).ping_buffer.write_buffer.data.element.length = sVar20;
      (websocket->ws_private).ping_buffer.write_buffer.next = &pcVar1->wb_head;
      (websocket->ws_private).ping_buffer.write_buffer.prev = &pcVar1->wb_head;
      (websocket->ws_private).ping_buffer.wb_head.next = pcVar2;
      (websocket->ws_private).ping_buffer.wb_head.prev = pcVar2;
      (websocket->ws_private).ping_buffer.wb_head.data.head.q_len = 1;
      (websocket->ws_private).ping_buffer.wb_head.data.element.length = sVar20;
    }
    if (websocket->on_control !=
        (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)0x0) {
      (*websocket->on_control)(websocket,CIO_WEBSOCKET_PING_FRAME,data,uVar18);
      sVar20 = (websocket->ws_private).ping_buffer.wb_head.data.element.length;
    }
    (websocket->ws_private).write_pong_job.wbh = &pcVar1->wb_head;
    (websocket->ws_private).write_pong_job.handler = pong_frame_written;
    (websocket->ws_private).write_pong_job.handler_context = (void *)0x0;
    (websocket->ws_private).write_pong_job.frame_type = CIO_WEBSOCKET_PONG_FRAME;
    (websocket->ws_private).write_pong_job.last_frame = true;
    (websocket->ws_private).write_pong_job.stream_handler = message_written;
    enqueue_job(websocket,&(websocket->ws_private).write_pong_job,sVar20);
    return;
  case 10:
    if (websocket->on_control !=
        (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)0x0) {
      (*websocket->on_control)(websocket,CIO_WEBSOCKET_PONG_FRAME,data,uVar18);
    }
    pcVar3 = (websocket->ws_private).http_client;
    err = cio_buffered_stream_read_at_least
                    (&pcVar3->buffered_stream,&pcVar3->rb,1,get_header,websocket);
    if (err == CIO_SUCCESS) {
      return;
    }
    reason = "could not restart receiving handling a pong frame received";
    status_code = CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR;
    goto LAB_0010dbdb;
  }
  err = CIO_PROTOCOL_NOT_SUPPORTED;
  status_code = CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR;
LAB_0010dbdb:
  handle_error(websocket,err,status_code,reason);
  return;
}

Assistant:

static void handle_frame(struct cio_websocket *websocket, uint8_t *data, uint64_t length)
{
	if (websocket->ws_private.ws_flags.is_server == 1U) {
		cio_websocket_mask(data, (size_t)length, websocket->ws_private.received_mask);
	}

	uint_fast8_t opcode = (uint_fast8_t)websocket->ws_private.ws_flags.opcode;
	switch (opcode) {
	case CIO_WEBSOCKET_BINARY_FRAME:
		handle_binary_frame(websocket, data, length, websocket->ws_private.ws_flags.fin == 1U);
		break;

	case CIO_WEBSOCKET_TEXT_FRAME:
		handle_text_frame(websocket, data, length, websocket->ws_private.ws_flags.fin == 1U);
		break;

	case CIO_WEBSOCKET_PING_FRAME:
		handle_ping_frame(websocket, data, (uint_fast8_t)length);
		break;

	case CIO_WEBSOCKET_PONG_FRAME:
		handle_pong_frame(websocket, data, (uint_fast8_t)length);
		break;

	case CIO_WEBSOCKET_CLOSE_FRAME:
		handle_close_frame(websocket, data, (uint_fast8_t)length);
		break;

	default:
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "reserved opcode used");
		break;
	}
}